

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O1

ggml_tensor * ggml_mul_mat_id(ggml_context *ctx,ggml_tensor *as,ggml_tensor *b,ggml_tensor *ids)

{
  ggml_tensor *pgVar1;
  char *pcVar2;
  int line;
  int64_t ne [4];
  int64_t local_38;
  long local_30;
  long local_28;
  undefined8 local_20;
  
  if (as->nb[1] < as->nb[0]) {
    pcVar2 = "!ggml_is_transposed(as)";
    line = 0xae1;
  }
  else if (ids->type == GGML_TYPE_I32) {
    if (as->ne[3] == 1) {
      if (b->ne[3] == 1) {
        if ((ids->ne[2] == 1) && (ids->ne[3] == 1)) {
          local_28 = b->ne[2];
          if (ids->ne[1] == local_28) {
            if (as->ne[0] == b->ne[0]) {
              local_30 = ids->ne[0];
              if (local_30 % b->ne[1] == 0) {
                local_38 = as->ne[1];
                local_20 = 1;
                pgVar1 = ggml_new_tensor_impl(ctx,GGML_TYPE_F32,4,&local_38,(ggml_tensor *)0x0,0);
                pgVar1->op = GGML_OP_MUL_MAT_ID;
                pgVar1->src[0] = as;
                pgVar1->src[1] = b;
                pgVar1->src[2] = ids;
                return pgVar1;
              }
              pcVar2 = "ids->ne[0] % b->ne[1] == 0";
              line = 0xae9;
            }
            else {
              pcVar2 = "as->ne[0] == b->ne[0]";
              line = 0xae8;
            }
          }
          else {
            pcVar2 = "ids->ne[1] == b->ne[2]";
            line = 0xae7;
          }
        }
        else {
          pcVar2 = "ids->ne[2] == 1 && ids->ne[3] == 1";
          line = 0xae6;
        }
      }
      else {
        pcVar2 = "b->ne[3] == 1";
        line = 0xae5;
      }
    }
    else {
      pcVar2 = "as->ne[3] == 1";
      line = 0xae4;
    }
  }
  else {
    pcVar2 = "ids->type == GGML_TYPE_I32";
    line = 0xae2;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/ggml.c",
             line,"GGML_ASSERT(%s) failed",pcVar2);
}

Assistant:

struct ggml_tensor * ggml_mul_mat_id(
        struct ggml_context * ctx,
        struct ggml_tensor  * as,
        struct ggml_tensor  * b,
        struct ggml_tensor  * ids) {
    GGML_ASSERT(!ggml_is_transposed(as));
    GGML_ASSERT(ids->type == GGML_TYPE_I32);

    GGML_ASSERT(as->ne[3] == 1); // as is 3d (one matrix per expert)
    GGML_ASSERT(b->ne[3] == 1); // b is 3d
    GGML_ASSERT(ids->ne[2] == 1 && ids->ne[3] == 1); // ids is 2d
    GGML_ASSERT(ids->ne[1] == b->ne[2]); // must have an expert list per b row
    GGML_ASSERT(as->ne[0] == b->ne[0]); // can_mul_mat
    GGML_ASSERT(ids->ne[0] % b->ne[1] == 0); // can broadcast

    const int64_t ne[4] = { as->ne[1], ids->ne[0], b->ne[2], 1 };
    struct ggml_tensor * result = ggml_new_tensor(ctx, GGML_TYPE_F32, 4, ne);

    result->op     = GGML_OP_MUL_MAT_ID;
    result->src[0] = as;
    result->src[1] = b;
    result->src[2] = ids;

    return result;
}